

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O1

void __thiscall cmGlobalNinjaGenerator::InitOutputPathPrefix(cmGlobalNinjaGenerator *this)

{
  string *psVar1;
  cmMakefile *this_00;
  char *pcVar2;
  size_type sVar3;
  char *__s;
  string local_48;
  
  this_00 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
              super__Vector_impl_data._M_start)->Makefile;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"CMAKE_NINJA_OUTPUT_PATH_PREFIX","");
  __s = cmMakefile::GetSafeDefinition(this_00,&local_48);
  psVar1 = &this->OutputPathPrefix;
  pcVar2 = (char *)(this->OutputPathPrefix)._M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)psVar1,0,pcVar2,(ulong)__s);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  sVar3 = (this->OutputPathPrefix)._M_string_length;
  if ((sVar3 != 0) && ((psVar1->_M_dataplus)._M_p[sVar3 - 1] != '/')) {
    std::__cxx11::string::push_back((char)psVar1);
  }
  return;
}

Assistant:

void cmGlobalNinjaGenerator::InitOutputPathPrefix()
{
  this->OutputPathPrefix =
    this->LocalGenerators[0]->GetMakefile()->GetSafeDefinition(
      "CMAKE_NINJA_OUTPUT_PATH_PREFIX");
  EnsureTrailingSlash(this->OutputPathPrefix);
}